

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngineTest.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_67cc9::SimpleBuildEngineDelegate::cycleDetected
          (SimpleBuildEngineDelegate *this,
          vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items)

{
  vector<llbuild::core::Rule_*,_std::allocator<llbuild::core::Rule_*>_> *items_local;
  SimpleBuildEngineDelegate *this_local;
  
  fprintf(_stderr,"error: cycle\n");
  abort();
}

Assistant:

virtual void cycleDetected(const std::vector<core::Rule*>& items) override {
    cycle.clear();
    std::transform(items.begin(), items.end(), std::back_inserter(cycle),
                   [](auto rule) { return rule->key.str(); });
  }